

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O2

void __thiscall re2c::DFA::reorder(DFA *this)

{
  uint uVar1;
  long lVar2;
  uint32_t i;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<re2c::State_*>,_bool> pVar4;
  State *s;
  vector<re2c::State_*,_std::allocator<re2c::State_*>_> ord;
  State *q;
  set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> done;
  queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> todo;
  
  ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::reserve(&ord,(ulong)this->nStates);
  std::queue<re2c::State*,std::deque<re2c::State*,std::allocator<re2c::State*>>>::
  queue<std::deque<re2c::State*,std::allocator<re2c::State*>>,void>(&todo);
  std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>::push_back(&todo.c,&this->head);
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &done._M_t._M_impl.super__Rb_tree_header._M_header;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  done._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       done._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
  ::_M_insert_unique<re2c::State*const&>
            ((_Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
              *)&done,&this->head);
  while (todo.c.super__Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         todo.c.super__Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    s = *todo.c.super__Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>::pop_front(&todo.c);
    std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::push_back(&ord,&s);
    lVar2 = 8;
    for (uVar3 = 0; uVar3 < (s->go).nSpans; uVar3 = uVar3 + 1) {
      q = *(State **)((long)&((s->go).span)->ub + lVar2);
      if (q != (State *)0x0) {
        pVar4 = std::
                _Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
                ::_M_insert_unique<re2c::State*const&>
                          ((_Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
                            *)&done,&q);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>::push_back(&todo.c,&q);
        }
      }
      lVar2 = lVar2 + 0x10;
    }
  }
  if ((long)ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (ulong)this->nStates) {
    s = (State *)0x0;
    std::vector<re2c::State*,std::allocator<re2c::State*>>::emplace_back<re2c::State*>
              ((vector<re2c::State*,std::allocator<re2c::State*>> *)&ord,&s);
    uVar1 = this->nStates;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3]->next =
           ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 + 1];
    }
    std::
    _Rb_tree<re2c::State_*,_re2c::State_*,_std::_Identity<re2c::State_*>,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>
    ::~_Rb_tree(&done._M_t);
    std::_Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>::~_Deque_base
              ((_Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_> *)&todo);
    std::_Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>::~_Vector_base
              (&ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>);
    return;
  }
  __assert_fail("nStates == ord.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/re2c/src/ir/adfa/adfa.cc"
                ,0x76,"void re2c::DFA::reorder()");
}

Assistant:

void DFA::reorder()
{
	std::vector<State*> ord;
	ord.reserve(nStates);

	std::queue<State*> todo;
	todo.push(head);

	std::set<State*> done;
	done.insert(head);

	for(;!todo.empty();)
	{
		State *s = todo.front();
		todo.pop();
		ord.push_back(s);
		for(uint32_t i = 0; i < s->go.nSpans; ++i)
		{
			State *q = s->go.span[i].to;
			if(q && done.insert(q).second)
			{
				todo.push(q);
			}
		}
	}

	assert(nStates == ord.size());

	ord.push_back(NULL);
	for(uint32_t i = 0; i < nStates; ++i)
	{
		ord[i]->next = ord[i + 1];
	}
}